

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O0

int gost_mac(gost_ctx *ctx,int mac_len,uchar *data,uint data_len,uchar *mac)

{
  uint in_ECX;
  long in_RDX;
  int in_ESI;
  byte *in_R8;
  uint i;
  byte buf2 [8];
  byte buffer [8];
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar1;
  byte *in_stack_ffffffffffffffc8;
  gost_ctx *in_stack_ffffffffffffffd0;
  
  memset(&stack0xffffffffffffffd0,0,8);
  for (uVar1 = 0; uVar1 + 8 <= in_ECX; uVar1 = uVar1 + 8) {
    mac_block(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
              (byte *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  }
  if (uVar1 < in_ECX) {
    memset(&stack0xffffffffffffffc8,0,8);
    memcpy(&stack0xffffffffffffffc8,(void *)(in_RDX + (ulong)uVar1),(ulong)(in_ECX - uVar1));
    mac_block(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
              (byte *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
    uVar1 = uVar1 + 8;
  }
  if (uVar1 == 8) {
    memset(&stack0xffffffffffffffc8,0,8);
    mac_block(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
              (byte *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  }
  get_mac(&stack0xffffffffffffffd0,in_ESI,in_R8);
  return 1;
}

Assistant:

int gost_mac(gost_ctx * ctx, int mac_len, const unsigned char *data,
             unsigned int data_len, unsigned char *mac)
{
    byte buffer[8] = { 0, 0, 0, 0, 0, 0, 0, 0 };
    byte buf2[8];
    unsigned int i;
    for (i = 0; i + 8 <= data_len; i += 8)
        mac_block(ctx, buffer, data + i);
    if (i < data_len) {
        memset(buf2, 0, 8);
        memcpy(buf2, data + i, data_len - i);
        mac_block(ctx, buffer, buf2);
        i += 8;
    }
    if (i == 8) {
        memset(buf2, 0, 8);
        mac_block(ctx, buffer, buf2);
    }
    get_mac(buffer, mac_len, mac);
    return 1;
}